

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

void enable_interrupt_cold_2(void)

{
  byte bVar1;
  uint in_ESI;
  long lVar2;
  long in_RDI;
  ulong uVar3;
  
  *(uint *)(*(long *)(in_RDI + 0x70) + 0x898) =
       *(uint *)(*(long *)(in_RDI + 0x70) + 0x898) | 0xc0000010;
  bVar1 = (byte)in_ESI;
  uVar3 = (long)((char)bVar1 * 2) & 0xfffffffffffffffc;
  *(uint *)(*(long *)(in_RDI + 0x70) + 0x900 + uVar3) =
       (int)(char)(bVar1 | 0x80) << (in_ESI << 4 & 0x1f) |
       ~(0xff << (in_ESI << 4 & 0x1f)) & *(uint *)(*(long *)(in_RDI + 0x70) + 0x900 + uVar3);
  *(undefined4 *)(*(long *)(in_RDI + 0x70) + 0x810) = 0xffff;
  lVar2 = 0x122a0;
  if ((ushort)in_ESI < 0x18) {
    lVar2 = 0x820;
  }
  *(undefined4 *)(*(long *)(in_RDI + 0x70) + lVar2 + (ulong)(in_ESI & 0xffff) * 4) =
       *(undefined4 *)(in_RDI + 0x5c);
  *(uint *)(*(long *)(in_RDI + 0x70) + 0x880) =
       *(uint *)(*(long *)(in_RDI + 0x70) + 0x880) | 1 << ((int)(char)bVar1 & 0x1fU);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Using MSIX interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",0xc9
          ,"enable_msix_interrupt");
  return;
}

Assistant:

static void enable_msix_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	// Step 1: The software driver associates between interrupt causes and MSI-X vectors and the
	// throttling timers EITR[n] by programming the IVAR[n] and IVAR_MISC registers.
	uint32_t gpie = get_reg32(dev->addr, IXGBE_GPIE);
	gpie |= IXGBE_GPIE_MSIX_MODE | IXGBE_GPIE_PBA_SUPPORT | IXGBE_GPIE_EIAME;
	set_reg32(dev->addr, IXGBE_GPIE, gpie);
	set_ivar(dev, 0, queue_id, queue_id);

	// Step 2: Program SRRCTL[n].RDMTS (per receive queue) if software uses the receive
	// descriptor minimum threshold interrupt
	// We don't use the minimum threshold interrupt

	// Step 3: The EIAC[n] registers should be set to auto clear for transmit and receive interrupt
	// causes (for best performance). The EIAC bits that control the other and TCP timer
	// interrupt causes should be set to 0b (no auto clear).
	set_reg32(dev->addr, IXGBE_EIAC, IXGBE_EIMS_RTX_QUEUE);

	// Step 4: Set the auto mask in the EIAM register according to the preferred mode of operation.
	// In our case we prefer to not auto-mask the interrupts

	// Step 5: Set the interrupt throttling in EITR[n] and GPIE according to the preferred mode of operation.
	// 0x000 (0us) => ... INT/s
	// 0x008 (2us) => 488200 INT/s
	// 0x010 (4us) => 244000 INT/s
	// 0x028 (10us) => 97600 INT/s
	// 0x0C8 (50us) => 20000 INT/s
	// 0x190 (100us) => 9766 INT/s
	// 0x320 (200us) => 4880 INT/s
	// 0x4B0 (300us) => 3255 INT/s
	// 0x640 (400us) => 2441 INT/s
	// 0x7D0 (500us) => 2000 INT/s
	// 0x960 (600us) => 1630 INT/s
	// 0xAF0 (700us) => 1400 INT/s
	// 0xC80 (800us) => 1220 INT/s
	// 0xE10 (900us) => 1080 INT/s
	// 0xFA7 (1000us) => 980 INT/s
	// 0xFFF (1024us) => 950 INT/s
	set_reg32(dev->addr, IXGBE_EITR(queue_id), dev->ixy.interrupts.itr_rate);

	// Step 6: Software enables the required interrupt causes by setting the EIMS register
	u32 mask = get_reg32(dev->addr, IXGBE_EIMS);
	mask |= (1 << queue_id);
	set_reg32(dev->addr, IXGBE_EIMS, mask);
	debug("Using MSIX interrupts");
}